

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  uint uVar2;
  UChar32 range [3];
  uint local_14;
  int local_10;
  undefined4 local_c;
  
  local_14 = 0x10ffff;
  if ((uint)start < 0x10ffff) {
    local_14 = start;
  }
  if (start < 0) {
    local_14 = 0;
  }
  uVar1 = 0x10ffff;
  if ((uint)end < 0x10ffff) {
    uVar1 = end;
  }
  if (local_14 < uVar1 && -1 < end) {
    local_10 = uVar1 + 1;
    local_c = 0x110000;
    add(this,(UChar32 *)&local_14,2,'\0');
  }
  else {
    uVar2 = 0;
    if (-1 < end) {
      uVar2 = uVar1;
    }
    if (local_14 == uVar2) {
      add(this,local_14);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) < pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        add(range, 2, 0);
    } else if (start == end) {
        add(start);
    }
    return *this;
}